

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

_Bool mpack_utf8_check_impl(uint8_t *str,size_t count,_Bool allow_null)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  
  do {
    uVar2 = count;
    if (uVar2 == 0) break;
    bVar1 = *str;
    count = uVar2;
    if ((!allow_null) && (bVar1 == 0)) goto LAB_00105a88;
    if ((char)bVar1 < '\0') {
      if ((bVar1 & 0xe0) == 0xc0) {
        if (uVar2 == 1) {
          count = 1;
        }
        else {
          bVar3 = (str[1] & 0xc0) == 0x80;
          str = str + (ulong)bVar3 * 2;
          if (bVar3 && (bVar1 & 0x1e) != 0) goto LAB_00105a9b;
        }
      }
      else if ((bVar1 & 0xf0) == 0xe0) {
        if (uVar2 < 3) {
LAB_00105a88:
          bVar3 = false;
          goto LAB_00105bea;
        }
      }
      else if ((uVar2 < 4) || ((bVar1 & 0xf8) != 0xf0)) goto LAB_00105a88;
      bVar3 = false;
    }
    else {
      str = str + 1;
      count = uVar2 - 1;
LAB_00105a9b:
      bVar3 = true;
    }
LAB_00105bea:
  } while (bVar3);
  return uVar2 == 0;
}

Assistant:

static bool mpack_utf8_check_impl(const uint8_t* str, size_t count, bool allow_null) {
    while (count > 0) {
        uint8_t lead = str[0];

        // NUL
        if (!allow_null && lead == '\0') // we don't allow NUL bytes in MPack C-strings
            return false;

        // ASCII
        if (lead <= 0x7F) {
            ++str;
            --count;

        // 2-byte sequence
        } else if ((lead & 0xE0) == 0xC0) {
            if (count < 2) // truncated sequence
                return false;

            uint8_t cont = str[1];
            if ((cont & 0xC0) != 0x80) // not a continuation byte
                return false;

            str += 2;
            count -= 2;

            uint32_t z = ((uint32_t)(lead & ~0xE0) << 6) |
                          (uint32_t)(cont & ~0xC0);

            if (z < 0x80) // overlong sequence
                return false;

        // 3-byte sequence
        } else if ((lead & 0xF0) == 0xE0) {
            if (count < 3) // truncated sequence
                return false;

            uint8_t cont1 = str[1];
            if ((cont1 & 0xC0) != 0x80) // not a continuation byte
                return false;
            uint8_t cont2 = str[2];
            if ((cont2 & 0xC0) != 0x80) // not a continuation byte
                return false;

            str += 3;
            count -= 3;

            uint32_t z = ((uint32_t)(lead  & ~0xF0) << 12) |
                         ((uint32_t)(cont1 & ~0xC0) <<  6) |
                          (uint32_t)(cont2 & ~0xC0);

            if (z < 0x800) // overlong sequence
                return false;
            if (z >= 0xD800 && z <= 0xDFFF) // surrogate
                return false;

        // 4-byte sequence
        } else if ((lead & 0xF8) == 0xF0) {
            if (count < 4) // truncated sequence
                return false;

            uint8_t cont1 = str[1];
            if ((cont1 & 0xC0) != 0x80) // not a continuation byte
                return false;
            uint8_t cont2 = str[2];
            if ((cont2 & 0xC0) != 0x80) // not a continuation byte
                return false;
            uint8_t cont3 = str[3];
            if ((cont3 & 0xC0) != 0x80) // not a continuation byte
                return false;

            str += 4;
            count -= 4;

            uint32_t z = ((uint32_t)(lead  & ~0xF8) << 18) |
                         ((uint32_t)(cont1 & ~0xC0) << 12) |
                         ((uint32_t)(cont2 & ~0xC0) <<  6) |
                          (uint32_t)(cont3 & ~0xC0);

            if (z < 0x10000) // overlong sequence
                return false;
            if (z > 0x10FFFF) // codepoint limit
                return false;

        } else {
            return false; // continuation byte without a lead, or lead for a 5-byte sequence or longer
        }
    }
    return true;
}